

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O2

string * __thiscall
BamTools::SamProgramChain::NextIdFor
          (string *__return_storage_ptr__,SamProgramChain *this,string *programId)

{
  pointer pSVar1;
  bool bVar2;
  __type _Var3;
  pointer this_00;
  
  this_00 = (this->m_data).
            super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_data).
           super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pSVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    bVar2 = SamProgram::HasPreviousProgramID(this_00);
    if ((!bVar2) && (_Var3 = std::operator==(&this_00->PreviousProgramID,programId), _Var3)) break;
    this_00 = this_00 + 1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this_00->ID);
  return __return_storage_ptr__;
}

Assistant:

const std::string SamProgramChain::NextIdFor(const std::string& programId) const
{

    // find first record in container whose PreviousProgramID matches @programId
    SamProgramConstIterator iter = ConstBegin();
    SamProgramConstIterator end = ConstEnd();
    for (; iter != end; ++iter) {
        const SamProgram& current = (*iter);
        if (!current.HasPreviousProgramID() && current.PreviousProgramID == programId) {
            return current.ID;
        }
    }

    // none found
    return std::string();
}